

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

ans_msb_encode * ans_msb_encode::create(uint32_t *in_u32,size_t n)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  int iVar1;
  uint32_t uVar2;
  reference pvVar3;
  uint *puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  reference pvVar6;
  reference pvVar7;
  uint64_t uVar8;
  ulong in_RDX;
  long in_RSI;
  ans_msb_encode *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  uint32_t mapped_u32;
  size_t i;
  uint32_t max_sym;
  uint32_t in_stack_00000094;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000098;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  ans_msb_encode *model;
  undefined4 in_stack_ffffffffffffff18;
  value_type vVar9;
  undefined4 in_stack_ffffffffffffff1c;
  uint32_t uVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type in_stack_ffffffffffffff38;
  undefined1 *__new_size;
  ans_msb_encode *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  ans_msb_encode *local_a0;
  undefined1 local_80 [28];
  uint32_t local_64;
  ulong local_60;
  uint local_58 [6];
  undefined8 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  byte local_19;
  ulong local_18;
  long local_10;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ans_msb_encode((ans_msb_encode *)in_stack_ffffffffffffff20._M_current);
  local_40 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x183267);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             in_stack_ffffffffffffff38,(value_type_conflict2 *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x183295);
  local_58[0] = 0;
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    local_64 = ans_msb_mapping(*(uint32_t *)(local_10 + local_60 * 4));
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,(ulong)local_64);
    *pvVar3 = *pvVar3 + 1;
    puVar4 = std::max<unsigned_int>(&local_64,local_58);
    local_58[0] = *puVar4;
  }
  adjust_freqs(in_stack_00000098,in_stack_00000094,max_sym._3_1_,i._4_4_);
  __new_size = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffff30,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff30);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  __last._M_current._4_4_ = in_stack_ffffffffffffff1c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff18;
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (in_stack_ffffffffffffff20,__last,0);
  this_00->frame_size = (long)iVar1;
  uVar2 = 0;
  local_a0 = (ans_msb_encode *)0x1000000000;
  std::vector<enc_entry_msb,_std::allocator<enc_entry_msb>_>::resize
            ((vector<enc_entry_msb,_std::allocator<enc_entry_msb>_> *)this_00,(size_type)__new_size)
  ;
  local_a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    this = local_a8;
    pvVar5 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->nfreqs);
    if (pvVar5 <= this) break;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_00->nfreqs,(size_type)local_a8);
    vVar9 = *pvVar6;
    pvVar7 = std::vector<enc_entry_msb,_std::allocator<enc_entry_msb>_>::operator[]
                       (&this_00->table,(size_type)local_a8);
    pvVar7->freq = vVar9;
    uVar10 = uVar2;
    pvVar7 = std::vector<enc_entry_msb,_std::allocator<enc_entry_msb>_>::operator[]
                       (&this_00->table,(size_type)local_a8);
    pvVar7->base = uVar10;
    in_stack_ffffffffffffff20._M_current = (uint *)local_a0;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_00->nfreqs,(size_type)local_a8);
    uVar8 = (long)in_stack_ffffffffffffff20._M_current * (ulong)*pvVar6;
    pvVar7 = std::vector<enc_entry_msb,_std::allocator<enc_entry_msb>_>::operator[]
                       (&this_00->table,(size_type)local_a8);
    pvVar7->sym_upper_bound = uVar8;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this_00->nfreqs,(size_type)local_a8);
    uVar2 = *pvVar6 + uVar2;
    local_a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_a8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  this_00->lower_bound = this_00->frame_size << 4;
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  if ((local_19 & 1) == 0) {
    ~ans_msb_encode((ans_msb_encode *)in_stack_ffffffffffffff20._M_current);
  }
  return in_RDI;
}

Assistant:

static ans_msb_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_msb_encode model;
        std::vector<uint64_t> freqs(msb_constants::MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_msb_mapping(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }